

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
zetGetMetricGroupProcAddrTable(ze_api_version_t version,zet_metric_group_dditable_t *pDdiTable)

{
  bool bVar1;
  bool bVar2;
  ze_result_t zVar3;
  size_type sVar4;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  reference pdVar5;
  reference pvVar6;
  code *pcVar7;
  zet_pfnGetMetricGroupProcAddrTable_t getTable_1;
  ze_result_t getTableResult;
  zet_pfnGetMetricGroupProcAddrTable_t getTable;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  bool atLeastOneDriverValid;
  ze_result_t result;
  zet_metric_group_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  sVar4 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                    ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                     (loader::context + 0x15e0));
  if (sVar4 == 0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (zet_metric_group_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (*(int *)(loader::context + 0x15c0) < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    bVar1 = false;
    this = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(loader::context + 0x15e0)
    ;
    __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
    drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                       *)&drv), bVar2) {
      pdVar5 = __gnu_cxx::
               __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
               ::operator*(&__end1);
      if ((pdVar5->initStatus == ZE_RESULT_SUCCESS) &&
         (pcVar7 = (code *)dlsym(pdVar5->handle,"zetGetMetricGroupProcAddrTable"),
         pcVar7 != (code *)0x0)) {
        zVar3 = (*pcVar7)(version,&(pdVar5->dditable).zet.MetricGroup);
        if (zVar3 == ZE_RESULT_SUCCESS) {
          bVar1 = true;
        }
        else {
          pdVar5->initStatus = zVar3;
        }
      }
      __gnu_cxx::
      __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
      ::operator++(&__end1);
    }
    if (bVar1) {
      __range1._4_4_ = ZE_RESULT_SUCCESS;
    }
    else {
      __range1._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
    }
    if (__range1._4_4_ == ZE_RESULT_SUCCESS) {
      sVar4 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                        ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                         (loader::context + 0x15e0));
      if ((sVar4 < 2) && ((*(byte *)(loader::context + 0x1629) & 1) == 0)) {
        pvVar6 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::front
                           ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                            (loader::context + 0x15e0));
        pDdiTable->pfnGet = (pvVar6->dditable).zet.MetricGroup.pfnGet;
        pDdiTable->pfnGetProperties = (pvVar6->dditable).zet.MetricGroup.pfnGetProperties;
        pDdiTable->pfnCalculateMetricValues =
             (pvVar6->dditable).zet.MetricGroup.pfnCalculateMetricValues;
      }
      else {
        pDdiTable->pfnGet = loader::zetMetricGroupGet;
        pDdiTable->pfnGetProperties = loader::zetMetricGroupGetProperties;
        pDdiTable->pfnCalculateMetricValues = loader::zetMetricGroupCalculateMetricValues;
      }
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1618) != 0)) {
      pcVar7 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1618),
                             "zetGetMetricGroupProcAddrTable");
      if (pcVar7 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      __range1._4_4_ = (*pcVar7)(version,pDdiTable);
    }
    pDdiTable_local._4_4_ = __range1._4_4_;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetMetricGroupProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_metric_group_dditable_t* pDdiTable          ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zet_pfnGetMetricGroupProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zetGetMetricGroupProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.zet.MetricGroup);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGet                                      = loader::zetMetricGroupGet;
            pDdiTable->pfnGetProperties                            = loader::zetMetricGroupGetProperties;
            pDdiTable->pfnCalculateMetricValues                    = loader::zetMetricGroupCalculateMetricValues;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.zet.MetricGroup;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zet_pfnGetMetricGroupProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zetGetMetricGroupProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}